

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_promise_resolve_function_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_val,int argc,JSValue *argv,int flags
                  )

{
  JSValueUnion *pJVar1;
  JSRuntime *pJVar2;
  BOOL BVar3;
  int iVar4;
  int is_reject;
  int64_t iVar5;
  JSValueUnion JVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue value;
  JSValue this_obj;
  JSValueUnion local_68;
  JSValueUnion JStack_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  pJVar1 = *(JSValueUnion **)((long)func_obj.u.ptr + 0x30);
  if ((pJVar1 == (JSValueUnion *)0x0) || (*(int *)((long)pJVar1[2].ptr + 4) != 0))
  goto LAB_0012a507;
  *(undefined4 *)((long)pJVar1[2].ptr + 4) = 1;
  is_reject = *(ushort *)((long)func_obj.u.ptr + 6) - 0x2b;
  if (argc < 1) {
    iVar5 = 3;
    JVar6.float64 = 0.0;
  }
  else {
    JVar6 = (JSValueUnion)(argv->u).ptr;
    iVar5 = argv->tag;
  }
  if ((int)iVar5 != -1 || is_reject != 0) {
LAB_0012a4ee:
    value.tag = iVar5;
    value.u.ptr = JVar6.ptr;
    fulfill_or_reject_promise(ctx,*(JSValue *)pJVar1,value,is_reject);
    goto LAB_0012a507;
  }
  JVar8.tag = iVar5;
  JVar8.u.ptr = JVar6.ptr;
  BVar3 = js_same_value(ctx,JVar8,*(JSValue *)pJVar1);
  if (BVar3 == 0) {
    JVar7.tag = iVar5;
    JVar7.u.ptr = JVar6.ptr;
    this_obj.tag = iVar5;
    this_obj.u.ptr = JVar6.ptr;
    JVar8 = JS_GetPropertyInternal(ctx,JVar7,0x7f,this_obj,0);
    if ((int)JVar8.tag == 6) goto LAB_0012a43a;
    iVar4 = JS_IsFunction(ctx,JVar8);
    if (iVar4 == 0) {
      JS_FreeValue(ctx,JVar8);
      goto LAB_0012a4ee;
    }
    local_68 = *pJVar1;
    JStack_60 = pJVar1[1];
    local_58 = JVar6;
    local_50 = iVar5;
    _local_48 = JVar8;
    JS_EnqueueJob(ctx,js_promise_resolve_thenable_job,3,(JSValue *)&local_68);
  }
  else {
    JS_ThrowTypeError(ctx,"promise self resolution");
LAB_0012a43a:
    pJVar2 = ctx->rt;
    JVar8 = pJVar2->current_exception;
    JVar7 = pJVar2->current_exception;
    (pJVar2->current_exception).u.int32 = 0;
    (pJVar2->current_exception).tag = 2;
    fulfill_or_reject_promise(ctx,*(JSValue *)pJVar1,JVar7,1);
  }
  JS_FreeValue(ctx,JVar8);
LAB_0012a507:
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue js_promise_resolve_function_call(JSContext *ctx,
                                                JSValueConst func_obj,
                                                JSValueConst this_val,
                                                int argc, JSValueConst *argv,
                                                int flags)
{
    JSObject *p = JS_VALUE_GET_OBJ(func_obj);
    JSPromiseFunctionData *s;
    JSValueConst resolution, args[3];
    JSValue then;
    BOOL is_reject;

    s = p->u.promise_function_data;
    if (!s || s->presolved->already_resolved)
        return JS_UNDEFINED;
    s->presolved->already_resolved = TRUE;
    is_reject = p->class_id - JS_CLASS_PROMISE_RESOLVE_FUNCTION;
    if (argc > 0)
        resolution = argv[0];
    else
        resolution = JS_UNDEFINED;
#ifdef DUMP_PROMISE
    printf("js_promise_resolving_function_call: is_reject=%d resolution=", is_reject);
    JS_DumpValue(ctx, resolution);
    printf("\n");
#endif
    if (is_reject || !JS_IsObject(resolution)) {
        goto done;
    } else if (js_same_value(ctx, resolution, s->promise)) {
        JS_ThrowTypeError(ctx, "promise self resolution");
        goto fail_reject;
    }
    then = JS_GetProperty(ctx, resolution, JS_ATOM_then);
    if (JS_IsException(then)) {
        JSValue error;
    fail_reject:
        error = JS_GetException(ctx);
        reject_promise(ctx, s->promise, error);
        JS_FreeValue(ctx, error);
    } else if (!JS_IsFunction(ctx, then)) {
        JS_FreeValue(ctx, then);
    done:
        fulfill_or_reject_promise(ctx, s->promise, resolution, is_reject);
    } else {
        args[0] = s->promise;
        args[1] = resolution;
        args[2] = then;
        JS_EnqueueJob(ctx, js_promise_resolve_thenable_job, 3, args);
        JS_FreeValue(ctx, then);
    }
    return JS_UNDEFINED;
}